

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O1

void Wlc_WinProfileArith(Wlc_Ntk_t *p)

{
  ushort *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vLeaves;
  int *piVar5;
  Vec_Int_t *vNodes;
  long lVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  Wlc_Obj_t *pObj;
  
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 1000;
  vLeaves->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vLeaves->pArray = piVar5;
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vNodes->pArray = piVar5;
  if (1 < p->iObj) {
    lVar6 = 1;
    lVar9 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar6) goto LAB_0037e236;
      puVar1 = (ushort *)(&p->pObjs->field_0x0 + lVar9);
      *puVar1 = *puVar1 & 0xff7f;
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar6 < p->iObj);
  }
  uVar12 = p->iObj;
  uVar11 = 0;
  if (1 < (int)uVar12) {
    lVar6 = 1;
    uVar2 = 0;
    do {
      if (p->nObjsAlloc <= lVar6) goto LAB_0037e236;
      pObj = p->pObjs + lVar6;
      iVar4 = Wlc_ObjHasArithm_rec(p,pObj);
      if (iVar4 == 0) {
        iVar4 = Wlc_ObjHasArithmFanins(p,pObj);
        if (iVar4 != 0) goto LAB_0037e0b5;
      }
      else if ((pObj->field_0x1 & 6) != 0) {
LAB_0037e0b5:
        Wlc_WinCompute(p,pObj,vLeaves,vNodes);
        iVar4 = Wlc_ManCountArithmReal(p,vNodes);
        if (1 < iVar4) {
          uVar12 = (int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555;
          pcVar7 = Wlc_ObjName(p,uVar12);
          printf("Arithmetic cone of node %d (%s):\n",(ulong)uVar12,pcVar7);
          Wlc_NtkPrintNode(p,pObj);
          iVar4 = vNodes->nSize;
          if (1 < iVar4) {
            piVar5 = vNodes->pArray;
            iVar8 = -1;
            lVar9 = 0;
            do {
              iVar3 = piVar5[lVar9];
              piVar5[lVar9] = piVar5[iVar4 + iVar8];
              piVar5[vNodes->nSize + iVar8] = iVar3;
              lVar9 = lVar9 + 1;
              iVar4 = vNodes->nSize;
              iVar8 = iVar8 + -1;
            } while (lVar9 < iVar4 / 2);
          }
          Wlc_NtkPrintNodeArray(p,vNodes);
          putchar(10);
          uVar2 = uVar2 + 1;
        }
      }
      lVar6 = lVar6 + 1;
      uVar12 = p->iObj;
    } while (lVar6 < (int)uVar12);
    uVar11 = (ulong)uVar2;
  }
  if (1 < (int)uVar12) {
    uVar10 = 1;
    if (1 < p->nObjsAlloc) {
      uVar10 = (ulong)(uint)p->nObjsAlloc;
    }
    lVar6 = 0x18;
    do {
      if (uVar10 * 0x18 == lVar6) {
LAB_0037e236:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (((&p->pObjs->field_0x0)[lVar6] & 0x80) != 0) {
        __assert_fail("pObj->Mark == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcWin.c"
                      ,0x9a,"void Wlc_WinProfileArith(Wlc_Ntk_t *)");
      }
      lVar6 = lVar6 + 0x18;
    } while ((ulong)uVar12 * 0x18 != lVar6);
  }
  printf("Finished printing %d arithmetic cones.\n",uVar11);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (int *)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (int *)0x0;
  }
  free(vNodes);
  return;
}

Assistant:

void Wlc_WinProfileArith( Wlc_Ntk_t * p )
{
    Vec_Int_t * vLeaves = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( 1000 );
    Wlc_Obj_t * pObj; int i, Count = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        if ( Wlc_ObjHasArithm_rec(p, pObj) ? Wlc_ObjIsCo(pObj) : Wlc_ObjHasArithmFanins(p, pObj) )
        {
            Wlc_WinCompute( p, pObj, vLeaves, vNodes ); 
            if ( Wlc_ManCountArithmReal(p, vNodes) < 2 )
                continue;

            printf( "Arithmetic cone of node %d (%s):\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
            Wlc_NtkPrintNode( p, pObj );
            Vec_IntReverseOrder( vNodes );
            Wlc_NtkPrintNodeArray( p, vNodes );
            printf( "\n" );
            Count++;
        }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark == 0 );
    printf( "Finished printing %d arithmetic cones.\n", Count );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
}